

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar1;
  string_view element_name;
  int index_local;
  VoidPtr local_40;
  code *pcStack_38;
  anon_class_24_3_22be947d make_error;
  
  make_error.index = &index_local;
  index_local = index;
  make_error.this = this;
  make_error.proto = proto;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     (&(proto->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase,index);
  pcStack_38 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::AddImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
  ;
  make_error_00.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::AddImportError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
  ;
  make_error_00.ptr_.obj = &make_error;
  element_name._M_str = (pVVar1->_M_dataplus)._M_p;
  element_name._M_len = pVVar1->_M_string_length;
  local_40.obj = &make_error;
  AddError(this,element_name,&proto->super_Message,IMPORT,make_error_00);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  auto make_error = [&] {
    if (pool_->fallback_database_ == nullptr) {
      return absl::StrCat("Import \"", proto.dependency(index),
                          "\" has not been loaded.");
    }
    return absl::StrCat("Import \"", proto.dependency(index),
                        "\" was not found or had errors.");
  };
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, make_error);
}